

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O3

void duckdb::RLEScanPartialInternal<unsigned_short,false>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  undefined2 uVar1;
  uint uVar2;
  _func_int *p_Var3;
  idx_t iVar4;
  data_ptr_t pdVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  pointer pSVar15;
  _func_int **pp_Var16;
  _func_int **pp_Var17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  _func_int **pp_Var22;
  ulong uVar23;
  undefined1 in_XMM2 [16];
  undefined1 auVar24 [16];
  int iVar25;
  int iVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar44 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  int iVar54;
  int iVar55;
  int iVar58;
  undefined1 auVar56 [16];
  int iVar59;
  undefined1 auVar57 [16];
  undefined1 in_XMM15 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  
  pSVar15 = unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
            ::operator->(&state->scan_state);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid
            ((optional_ptr<duckdb::FileBuffer,_true> *)(pSVar15 + 3));
  p_Var3 = pSVar15[3]._vptr_SegmentScanState[2];
  iVar4 = segment->offset;
  uVar2 = *(uint *)&pSVar15[6]._vptr_SegmentScanState;
  pdVar5 = result->data;
  Vector::SetVectorType(result,FLAT_VECTOR);
  auVar29 = _DAT_01da0bd0;
  auVar28 = _DAT_01da0bc0;
  auVar14 = _DAT_01d9fb10;
  auVar27 = _DAT_01d9fb00;
  uVar23 = scan_count + result_offset;
  if (result_offset < uVar23) {
    pp_Var17 = pSVar15[4]._vptr_SegmentScanState;
    pp_Var16 = pSVar15[5]._vptr_SegmentScanState;
    auVar32._8_4_ = 0xffffffff;
    auVar32._0_8_ = 0xffffffffffffffff;
    auVar32._12_4_ = 0xffffffff;
    do {
      pp_Var22 = (_func_int **)(ulong)*(ushort *)(p_Var3 + (long)pp_Var17 * 2 + uVar2 + iVar4);
      uVar21 = (long)pp_Var22 - (long)pp_Var16;
      uVar20 = uVar23 - result_offset;
      uVar1 = *(undefined2 *)(p_Var3 + (long)pp_Var17 * 2 + iVar4 + 8);
      if (uVar20 < uVar21) {
        if (uVar23 != result_offset) {
          lVar18 = uVar20 + (uVar20 == 0);
          lVar19 = lVar18 + -1;
          auVar60._8_4_ = (int)lVar19;
          auVar60._0_8_ = lVar19;
          auVar60._12_4_ = (int)((ulong)lVar19 >> 0x20);
          uVar23 = 0;
          auVar60 = auVar60 ^ auVar14;
          auVar61._8_4_ = 0xffffffff;
          auVar61._0_8_ = 0xffffffffffffffff;
          auVar61._12_4_ = 0xffffffff;
          auVar27 = _DAT_01da0bb0;
          auVar28 = _DAT_01da0bc0;
          auVar29 = _DAT_01da0bd0;
          auVar45 = _DAT_01d9fb00;
          do {
            auVar32 = auVar45 ^ auVar14;
            iVar55 = auVar60._0_4_;
            iVar54 = -(uint)(iVar55 < auVar32._0_4_);
            iVar25 = auVar60._4_4_;
            auVar33._4_4_ = -(uint)(iVar25 < auVar32._4_4_);
            iVar59 = auVar60._8_4_;
            iVar58 = -(uint)(iVar59 < auVar32._8_4_);
            iVar26 = auVar60._12_4_;
            auVar33._12_4_ = -(uint)(iVar26 < auVar32._12_4_);
            auVar39._4_4_ = iVar54;
            auVar39._0_4_ = iVar54;
            auVar39._8_4_ = iVar58;
            auVar39._12_4_ = iVar58;
            auVar44 = pshuflw(in_XMM11,auVar39,0xe8);
            auVar49._4_4_ = -(uint)(auVar32._4_4_ == iVar25);
            auVar49._12_4_ = -(uint)(auVar32._12_4_ == iVar26);
            auVar49._0_4_ = auVar49._4_4_;
            auVar49._8_4_ = auVar49._12_4_;
            auVar53 = pshuflw(in_XMM12,auVar49,0xe8);
            auVar33._0_4_ = auVar33._4_4_;
            auVar33._8_4_ = auVar33._12_4_;
            auVar32 = pshuflw(auVar44,auVar33,0xe8);
            auVar32 = (auVar32 | auVar53 & auVar44) ^ auVar61;
            auVar32 = packssdw(auVar32,auVar32);
            if ((auVar32 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined2 *)(pdVar5 + uVar23 * 2 + result_offset * 2) = uVar1;
            }
            auVar33 = auVar49 & auVar39 | auVar33;
            auVar32 = packssdw(auVar33,auVar33);
            auVar32 = packssdw(auVar32 ^ auVar61,auVar32 ^ auVar61);
            if ((auVar32._0_4_ >> 0x10 & 1) != 0) {
              *(undefined2 *)(pdVar5 + uVar23 * 2 + result_offset * 2 + 2) = uVar1;
            }
            auVar32 = auVar29 ^ auVar14;
            iVar54 = -(uint)(iVar55 < auVar32._0_4_);
            auVar42._4_4_ = -(uint)(iVar25 < auVar32._4_4_);
            iVar58 = -(uint)(iVar59 < auVar32._8_4_);
            auVar42._12_4_ = -(uint)(iVar26 < auVar32._12_4_);
            auVar34._4_4_ = iVar54;
            auVar34._0_4_ = iVar54;
            auVar34._8_4_ = iVar58;
            auVar34._12_4_ = iVar58;
            auVar38._4_4_ = -(uint)(auVar32._4_4_ == iVar25);
            auVar38._12_4_ = -(uint)(auVar32._12_4_ == iVar26);
            auVar38._0_4_ = auVar38._4_4_;
            auVar38._8_4_ = auVar38._12_4_;
            auVar42._0_4_ = auVar42._4_4_;
            auVar42._8_4_ = auVar42._12_4_;
            auVar32 = auVar38 & auVar34 | auVar42;
            auVar32 = packssdw(auVar32,auVar32);
            auVar32 = packssdw(auVar32 ^ auVar61,auVar32 ^ auVar61);
            if ((auVar32 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined2 *)(pdVar5 + uVar23 * 2 + result_offset * 2 + 4) = uVar1;
            }
            auVar49 = pshufhw(auVar34,auVar34,0x84);
            auVar39 = pshufhw(auVar38,auVar38,0x84);
            auVar33 = pshufhw(auVar49,auVar42,0x84);
            auVar49 = (auVar33 | auVar39 & auVar49) ^ auVar61;
            auVar49 = packssdw(auVar49,auVar49);
            if ((auVar49 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined2 *)(pdVar5 + uVar23 * 2 + result_offset * 2 + 6) = uVar1;
            }
            auVar49 = auVar28 ^ auVar14;
            iVar54 = -(uint)(iVar55 < auVar49._0_4_);
            auVar36._4_4_ = -(uint)(iVar25 < auVar49._4_4_);
            iVar58 = -(uint)(iVar59 < auVar49._8_4_);
            auVar36._12_4_ = -(uint)(iVar26 < auVar49._12_4_);
            auVar40._4_4_ = iVar54;
            auVar40._0_4_ = iVar54;
            auVar40._8_4_ = iVar58;
            auVar40._12_4_ = iVar58;
            auVar32 = pshuflw(auVar32,auVar40,0xe8);
            auVar35._4_4_ = -(uint)(auVar49._4_4_ == iVar25);
            auVar35._12_4_ = -(uint)(auVar49._12_4_ == iVar26);
            auVar35._0_4_ = auVar35._4_4_;
            auVar35._8_4_ = auVar35._12_4_;
            in_XMM12 = pshuflw(auVar53 & auVar44,auVar35,0xe8);
            in_XMM12 = in_XMM12 & auVar32;
            auVar36._0_4_ = auVar36._4_4_;
            auVar36._8_4_ = auVar36._12_4_;
            auVar32 = pshuflw(auVar32,auVar36,0xe8);
            auVar32 = (auVar32 | in_XMM12) ^ auVar61;
            auVar32 = packssdw(auVar32,auVar32);
            if ((auVar32 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined2 *)(pdVar5 + uVar23 * 2 + result_offset * 2 + 8) = uVar1;
            }
            auVar36 = auVar35 & auVar40 | auVar36;
            auVar32 = packssdw(auVar36,auVar36);
            auVar32 = packssdw(auVar32 ^ auVar61,auVar32 ^ auVar61);
            if ((auVar32 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              *(undefined2 *)(pdVar5 + uVar23 * 2 + result_offset * 2 + 10) = uVar1;
            }
            auVar32 = auVar27 ^ auVar14;
            iVar55 = -(uint)(iVar55 < auVar32._0_4_);
            auVar43._4_4_ = -(uint)(iVar25 < auVar32._4_4_);
            iVar59 = -(uint)(iVar59 < auVar32._8_4_);
            auVar43._12_4_ = -(uint)(iVar26 < auVar32._12_4_);
            auVar44._4_4_ = iVar55;
            auVar44._0_4_ = iVar55;
            auVar44._8_4_ = iVar59;
            auVar44._12_4_ = iVar59;
            auVar53._4_4_ = -(uint)(auVar32._4_4_ == iVar25);
            auVar53._12_4_ = -(uint)(auVar32._12_4_ == iVar26);
            auVar53._0_4_ = auVar53._4_4_;
            auVar53._8_4_ = auVar53._12_4_;
            auVar43._0_4_ = auVar43._4_4_;
            auVar43._8_4_ = auVar43._12_4_;
            auVar32 = auVar53 & auVar44 | auVar43;
            auVar32 = packssdw(auVar32,auVar32);
            in_XMM11 = packssdw(auVar32 ^ auVar61,auVar32 ^ auVar61);
            if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined2 *)(pdVar5 + uVar23 * 2 + result_offset * 2 + 0xc) = uVar1;
            }
            auVar32 = pshufhw(auVar44,auVar44,0x84);
            auVar33 = pshufhw(auVar53,auVar53,0x84);
            auVar49 = pshufhw(auVar32,auVar43,0x84);
            auVar32 = (auVar49 | auVar33 & auVar32) ^ auVar61;
            auVar32 = packssdw(auVar32,auVar32);
            if ((auVar32 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined2 *)(pdVar5 + uVar23 * 2 + result_offset * 2 + 0xe) = uVar1;
            }
            uVar23 = uVar23 + 8;
            lVar19 = auVar45._8_8_;
            auVar45._0_8_ = auVar45._0_8_ + 8;
            auVar45._8_8_ = lVar19 + 8;
            lVar19 = auVar29._8_8_;
            auVar29._0_8_ = auVar29._0_8_ + 8;
            auVar29._8_8_ = lVar19 + 8;
            lVar19 = auVar28._8_8_;
            auVar28._0_8_ = auVar28._0_8_ + 8;
            auVar28._8_8_ = lVar19 + 8;
            lVar19 = auVar27._8_8_;
            auVar27._0_8_ = auVar27._0_8_ + 8;
            auVar27._8_8_ = lVar19 + 8;
          } while ((lVar18 + 7U & 0xfffffffffffffff8) != uVar23);
        }
        pSVar15[5]._vptr_SegmentScanState = (_func_int **)((long)pp_Var16 + uVar20);
        return;
      }
      if (pp_Var22 != pp_Var16) {
        lVar18 = uVar21 - 1;
        auVar30._8_4_ = (int)lVar18;
        auVar30._0_8_ = lVar18;
        auVar30._12_4_ = (int)((ulong)lVar18 >> 0x20);
        lVar18 = result_offset * 2;
        auVar30 = auVar30 ^ auVar14;
        uVar20 = 0;
        auVar31 = auVar27;
        auVar37 = auVar29;
        auVar41 = auVar28;
        in_XMM11 = _DAT_01da0bb0;
        do {
          auVar45 = auVar31 ^ auVar14;
          iVar55 = auVar30._0_4_;
          iVar54 = -(uint)(iVar55 < auVar45._0_4_);
          iVar25 = auVar30._4_4_;
          auVar47._4_4_ = -(uint)(iVar25 < auVar45._4_4_);
          iVar59 = auVar30._8_4_;
          iVar58 = -(uint)(iVar59 < auVar45._8_4_);
          iVar26 = auVar30._12_4_;
          auVar47._12_4_ = -(uint)(iVar26 < auVar45._12_4_);
          auVar6._4_4_ = iVar54;
          auVar6._0_4_ = iVar54;
          auVar6._8_4_ = iVar58;
          auVar6._12_4_ = iVar58;
          auVar60 = pshuflw(in_XMM15,auVar6,0xe8);
          auVar46._4_4_ = -(uint)(auVar45._4_4_ == iVar25);
          auVar46._12_4_ = -(uint)(auVar45._12_4_ == iVar26);
          auVar46._0_4_ = auVar46._4_4_;
          auVar46._8_4_ = auVar46._12_4_;
          auVar45 = pshuflw(in_XMM2,auVar46,0xe8);
          auVar47._0_4_ = auVar47._4_4_;
          auVar47._8_4_ = auVar47._12_4_;
          auVar61 = pshuflw(auVar60,auVar47,0xe8);
          auVar45 = (auVar61 | auVar45 & auVar60) ^ auVar32;
          auVar45 = packssdw(auVar45,auVar45);
          if ((auVar45 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(undefined2 *)(pdVar5 + uVar20 * 2 + lVar18) = uVar1;
          }
          auVar7._4_4_ = iVar54;
          auVar7._0_4_ = iVar54;
          auVar7._8_4_ = iVar58;
          auVar7._12_4_ = iVar58;
          auVar47 = auVar46 & auVar7 | auVar47;
          auVar60 = packssdw(auVar47,auVar47);
          auVar60 = packssdw(auVar60 ^ auVar32,auVar60 ^ auVar32);
          if ((auVar60._0_4_ >> 0x10 & 1) != 0) {
            *(undefined2 *)(pdVar5 + uVar20 * 2 + lVar18 + 2) = uVar1;
          }
          auVar60 = auVar37 ^ auVar14;
          iVar54 = -(uint)(iVar55 < auVar60._0_4_);
          auVar56._4_4_ = -(uint)(iVar25 < auVar60._4_4_);
          iVar58 = -(uint)(iVar59 < auVar60._8_4_);
          auVar56._12_4_ = -(uint)(iVar26 < auVar60._12_4_);
          auVar48._4_4_ = iVar54;
          auVar48._0_4_ = iVar54;
          auVar48._8_4_ = iVar58;
          auVar48._12_4_ = iVar58;
          iVar54 = -(uint)(auVar60._4_4_ == iVar25);
          iVar58 = -(uint)(auVar60._12_4_ == iVar26);
          auVar8._4_4_ = iVar54;
          auVar8._0_4_ = iVar54;
          auVar8._8_4_ = iVar58;
          auVar8._12_4_ = iVar58;
          auVar56._0_4_ = auVar56._4_4_;
          auVar56._8_4_ = auVar56._12_4_;
          auVar60 = auVar8 & auVar48 | auVar56;
          auVar60 = packssdw(auVar60,auVar60);
          auVar60 = packssdw(auVar60 ^ auVar32,auVar60 ^ auVar32);
          if ((auVar60 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(undefined2 *)(pdVar5 + uVar20 * 2 + lVar18 + 4) = uVar1;
          }
          auVar60 = pshufhw(auVar60,auVar48,0x84);
          auVar9._4_4_ = iVar54;
          auVar9._0_4_ = iVar54;
          auVar9._8_4_ = iVar58;
          auVar9._12_4_ = iVar58;
          auVar49 = pshufhw(auVar48,auVar9,0x84);
          auVar61 = pshufhw(auVar60,auVar56,0x84);
          auVar60 = (auVar61 | auVar49 & auVar60) ^ auVar32;
          auVar60 = packssdw(auVar60,auVar60);
          if ((auVar60 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(undefined2 *)(pdVar5 + uVar20 * 2 + lVar18 + 6) = uVar1;
          }
          auVar60 = auVar41 ^ auVar14;
          iVar54 = -(uint)(iVar55 < auVar60._0_4_);
          auVar51._4_4_ = -(uint)(iVar25 < auVar60._4_4_);
          iVar58 = -(uint)(iVar59 < auVar60._8_4_);
          auVar51._12_4_ = -(uint)(iVar26 < auVar60._12_4_);
          auVar10._4_4_ = iVar54;
          auVar10._0_4_ = iVar54;
          auVar10._8_4_ = iVar58;
          auVar10._12_4_ = iVar58;
          auVar61 = pshuflw(auVar45,auVar10,0xe8);
          auVar24._0_4_ = -(uint)(auVar60._0_4_ == iVar55);
          auVar24._4_4_ = -(uint)(auVar60._4_4_ == iVar25);
          auVar24._8_4_ = -(uint)(auVar60._8_4_ == iVar59);
          auVar24._12_4_ = -(uint)(auVar60._12_4_ == iVar26);
          auVar50._4_4_ = auVar24._4_4_;
          auVar50._0_4_ = auVar24._4_4_;
          auVar50._8_4_ = auVar24._12_4_;
          auVar50._12_4_ = auVar24._12_4_;
          auVar45 = pshuflw(auVar24,auVar50,0xe8);
          auVar51._0_4_ = auVar51._4_4_;
          auVar51._8_4_ = auVar51._12_4_;
          auVar60 = pshuflw(auVar61,auVar51,0xe8);
          in_XMM15 = (auVar60 | auVar45 & auVar61) ^ auVar32;
          auVar45 = packssdw(auVar45 & auVar61,in_XMM15);
          if ((auVar45 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(undefined2 *)(pdVar5 + uVar20 * 2 + lVar18 + 8) = uVar1;
          }
          auVar11._4_4_ = iVar54;
          auVar11._0_4_ = iVar54;
          auVar11._8_4_ = iVar58;
          auVar11._12_4_ = iVar58;
          auVar51 = auVar50 & auVar11 | auVar51;
          auVar60 = packssdw(auVar51,auVar51);
          auVar45 = packssdw(auVar45,auVar60 ^ auVar32);
          if ((auVar45 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            *(undefined2 *)(pdVar5 + uVar20 * 2 + lVar18 + 10) = uVar1;
          }
          auVar45 = in_XMM11 ^ auVar14;
          iVar55 = -(uint)(iVar55 < auVar45._0_4_);
          auVar57._4_4_ = -(uint)(iVar25 < auVar45._4_4_);
          iVar59 = -(uint)(iVar59 < auVar45._8_4_);
          auVar57._12_4_ = -(uint)(iVar26 < auVar45._12_4_);
          auVar52._4_4_ = iVar55;
          auVar52._0_4_ = iVar55;
          auVar52._8_4_ = iVar59;
          auVar52._12_4_ = iVar59;
          iVar55 = -(uint)(auVar45._4_4_ == iVar25);
          iVar25 = -(uint)(auVar45._12_4_ == iVar26);
          auVar12._4_4_ = iVar55;
          auVar12._0_4_ = iVar55;
          auVar12._8_4_ = iVar25;
          auVar12._12_4_ = iVar25;
          auVar57._0_4_ = auVar57._4_4_;
          auVar57._8_4_ = auVar57._12_4_;
          auVar45 = auVar12 & auVar52 | auVar57;
          auVar45 = packssdw(auVar45,auVar45);
          auVar45 = packssdw(auVar45 ^ auVar32,auVar45 ^ auVar32);
          if ((auVar45 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(undefined2 *)(pdVar5 + uVar20 * 2 + lVar18 + 0xc) = uVar1;
          }
          auVar45 = pshufhw(auVar45,auVar52,0x84);
          auVar13._4_4_ = iVar55;
          auVar13._0_4_ = iVar55;
          auVar13._8_4_ = iVar25;
          auVar13._12_4_ = iVar25;
          in_XMM12 = pshufhw(auVar52,auVar13,0x84);
          in_XMM12 = in_XMM12 & auVar45;
          auVar45 = pshufhw(auVar45,auVar57,0x84);
          auVar45 = (auVar45 | in_XMM12) ^ auVar32;
          in_XMM2 = packssdw(auVar45,auVar45);
          if ((in_XMM2 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(undefined2 *)(pdVar5 + uVar20 * 2 + lVar18 + 0xe) = uVar1;
          }
          uVar20 = uVar20 + 8;
          lVar19 = auVar31._8_8_;
          auVar31._0_8_ = auVar31._0_8_ + 8;
          auVar31._8_8_ = lVar19 + 8;
          lVar19 = auVar37._8_8_;
          auVar37._0_8_ = auVar37._0_8_ + 8;
          auVar37._8_8_ = lVar19 + 8;
          lVar19 = auVar41._8_8_;
          auVar41._0_8_ = auVar41._0_8_ + 8;
          auVar41._8_8_ = lVar19 + 8;
          lVar19 = in_XMM11._8_8_;
          in_XMM11._0_8_ = in_XMM11._0_8_ + 8;
          in_XMM11._8_8_ = lVar19 + 8;
        } while ((uVar21 + 7 & 0xfffffffffffffff8) != uVar20);
      }
      result_offset = result_offset + uVar21;
      pp_Var17 = (_func_int **)((long)pp_Var17 + 1);
      pSVar15[4]._vptr_SegmentScanState = pp_Var17;
      pSVar15[5]._vptr_SegmentScanState = (_func_int **)0x0;
      pp_Var16 = (_func_int **)0x0;
    } while (result_offset < uVar23);
  }
  return;
}

Assistant:

void RLEScanPartialInternal(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                            idx_t result_offset) {
	auto &scan_state = state.scan_state->Cast<RLEScanState<T>>();

	auto data = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto data_pointer = reinterpret_cast<T *>(data + RLEConstants::RLE_HEADER_SIZE);
	auto index_pointer = reinterpret_cast<rle_count_t *>(data + scan_state.rle_count_offset);

	// If we are scanning an entire Vector and it contains only a single run
	if (CanEmitConstantVector<ENTIRE_VECTOR>(scan_state.position_in_entry, index_pointer[scan_state.entry_pos],
	                                         scan_count)) {
		RLEScanConstant<T>(scan_state, index_pointer, data_pointer, scan_count, result);
		return;
	}

	auto result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	idx_t result_end = result_offset + scan_count;
	while (result_offset < result_end) {
		rle_count_t run_end = index_pointer[scan_state.entry_pos];
		idx_t run_count = run_end - scan_state.position_in_entry;
		idx_t remaining_scan_count = result_end - result_offset;
		T element = data_pointer[scan_state.entry_pos];
		if (DUCKDB_UNLIKELY(run_count > remaining_scan_count)) {
			for (idx_t i = 0; i < remaining_scan_count; i++) {
				result_data[result_offset + i] = element;
			}
			scan_state.position_in_entry += remaining_scan_count;
			break;
		}

		for (idx_t i = 0; i < run_count; i++) {
			result_data[result_offset + i] = element;
		}

		result_offset += run_count;
		scan_state.ForwardToNextRun();
	}
}